

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameplayDisplayer.cpp
# Opt level: O0

void __thiscall GameplayDisplayer::drawPause(GameplayDisplayer *this,GLfloat width)

{
  int iVar1;
  GLfloat GVar2;
  int local_24;
  int local_20;
  int i_1;
  int i;
  GLint pauseHeight;
  GLint smallSize;
  GLfloat width_local;
  GameplayDisplayer *this_local;
  
  GVar2 = PrimitiveDisplayer::getPixelsPerSquare(this->primitiveDisplayer);
  iVar1 = (int)(GVar2 / 2.0);
  glColor4f(0x3f800000,0x3f800000,0x3f800000,0x3ecccccd);
  glPushMatrix();
  glTranslatef(width - (float)(iVar1 * 3),(float)(iVar1 << 1),0);
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    PrimitiveDisplayer::drawSquare(this->primitiveDisplayer,(float)iVar1);
    glTranslatef(0,(float)iVar1);
  }
  glTranslatef((float)(iVar1 * -2),(float)(iVar1 * -4),0);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    PrimitiveDisplayer::drawSquare(this->primitiveDisplayer,(float)iVar1);
    glTranslatef(0,(float)iVar1);
  }
  glPopMatrix();
  return;
}

Assistant:

void GameplayDisplayer::drawPause(GLfloat width) {
    GLint smallSize = primitiveDisplayer->getPixelsPerSquare() / 2;
    GLint pauseHeight = 4;
    
    glColor4f(1.0f, 1.0f, 1.0f, 0.4f);
    
    glPushMatrix();
        glTranslatef(width - smallSize * 3, smallSize * 2, 0.0f);
        for (int i=0; i < pauseHeight; i++) {
            primitiveDisplayer->drawSquare(smallSize);
            glTranslatef(0.0f, smallSize, 0.0f);
        }

        glTranslatef(-2*smallSize, -pauseHeight * smallSize, 0.0f);
        for (int i=0; i < pauseHeight; i++) {
            primitiveDisplayer->drawSquare(smallSize);
            glTranslatef(0.0f, smallSize, 0.0f);
        }
    glPopMatrix();
}